

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::NewPoWValidBlock
          (PeerManagerImpl *this,CBlockIndex *pindex,shared_ptr<const_CBlock> *pblock)

{
  int iVar1;
  CBlock *__args;
  element_type *peVar2;
  pointer psVar3;
  CConnman *this_00;
  element_type *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result<CSerializedNetMsg> *this_01;
  _State_baseV2 *__tmp;
  shared_ptr<const_CTransaction> *tx;
  pointer __args_1;
  long in_FS_OFFSET;
  __single_object most_recent_block_txs;
  shared_ptr<const_CBlockHeaderAndShortTxIDs> pcmpctblock;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock43;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock42;
  uint256 hashBlock;
  __basic_future<CSerializedNetMsg> local_120;
  element_type *local_110;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_108;
  CBlockHeaderAndShortTxIDs *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  _Any_data local_f0;
  code *local_e0;
  code *local_d8;
  unique_lock<std::recursive_mutex> local_d0;
  FastRandomContext local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __args = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  FastRandomContext::FastRandomContext(&local_c0,false);
  local_f0._M_unused._M_member_pointer = FastRandomContext::rand64(&local_c0);
  local_100 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CBlockHeaderAndShortTxIDs_const,std::allocator<CBlockHeaderAndShortTxIDs>,CBlock_const&,unsigned_long>
            (&local_f8,&local_100,(allocator<CBlockHeaderAndShortTxIDs> *)&local_d0,__args,
             (unsigned_long *)local_f0._M_pod_data);
  ChaCha20::~ChaCha20(&local_c0.rng);
  local_d0._M_device = &cs_main.super_recursive_mutex;
  local_d0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_d0);
  iVar1 = pindex->nHeight;
  if ((this->m_highest_fast_announce < iVar1) &&
     (this->m_highest_fast_announce = iVar1,
     (((this->m_chainman->m_options).chainparams)->consensus).SegwitHeight <= iVar1)) {
    CBlockHeader::GetHash
              ((uint256 *)&local_c0,
               &((pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_CBlockHeader);
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_01391450;
    p_Var4[1]._M_use_count = 0;
    p_Var4[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var4[2]._vptr__Sp_counted_base = 0;
    *(undefined1 *)((long)&p_Var4[2]._vptr__Sp_counted_base + 4) = 0;
    p_Var4[2]._M_use_count = 0;
    p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_013914a0;
    this_01 = (_Result<CSerializedNetMsg> *)operator_new(0x50);
    std::__future_base::_Result<CSerializedNetMsg>::_Result(this_01);
    p_Var4[3]._vptr__Sp_counted_base = (_func_int **)this_01;
    *(CBlockHeaderAndShortTxIDs ***)&p_Var4[3]._M_use_count = &local_100;
    local_f0._M_unused._M_object = p_Var4 + 1;
    local_f0._8_8_ = p_Var4;
    std::__basic_future<CSerializedNetMsg>::__basic_future(&local_120,(__state_type *)&local_f0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
    }
    local_110 = local_120._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    local_108 = local_120._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    local_120._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0x30);
    (local_120._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_status = (atomic<unsigned_int>)0x0;
    (local_120._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)
     &(local_120._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      field_0x15 = 0;
    *(undefined8 *)
     &(local_120._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _M_once = 0;
    (local_120._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr__State_baseV2 = (_func_int **)0x0;
    ((local_120._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_result)._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
         (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)0x0;
    *(_Ptr_type **)
     &(local_120._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _M_once = &(local_120._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->_M_result;
    local_120._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _vptr__State_baseV2 =
         (_func_int **)
         &(local_120._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_M_result;
    local_120._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
         (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)0x0;
    peVar2 = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar3 = (peVar2->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__args_1 = (peVar2->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; __args_1 != psVar3;
        __args_1 = __args_1 + 1) {
      std::
      _Rb_tree<uint256,std::pair<uint256_const,std::shared_ptr<CTransaction_const>>,std::_Select1st<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
      ::
      _M_emplace_unique<transaction_identifier<false>const&,std::shared_ptr<CTransaction_const>const&>
                ((_Rb_tree<uint256,std::pair<uint256_const,std::shared_ptr<CTransaction_const>>,std::_Select1st<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
                  *)local_120._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
                 &((__args_1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->hash,__args_1);
      std::
      _Rb_tree<uint256,std::pair<uint256_const,std::shared_ptr<CTransaction_const>>,std::_Select1st<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
      ::
      _M_emplace_unique<transaction_identifier<true>const&,std::shared_ptr<CTransaction_const>const&>
                ((_Rb_tree<uint256,std::pair<uint256_const,std::shared_ptr<CTransaction_const>>,std::_Select1st<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>,std::less<uint256>,std::allocator<std::pair<uint256_const,std::shared_ptr<CTransaction_const>>>>
                  *)local_120._M_state.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr,
                 &((__args_1->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->m_witness_hash,__args_1);
    }
    local_f0._M_unused._M_object = &this->m_most_recent_block_mutex;
    local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_f0);
    *(undefined8 *)((this->m_most_recent_block_hash).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_c0.rng.m_aligned.input._0_8_;
    *(undefined8 *)((this->m_most_recent_block_hash).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_c0.rng.m_aligned.input._8_8_;
    *(uint64_t *)(this->m_most_recent_block_hash).super_base_blob<256U>.m_data._M_elems =
         local_c0.super_RandomMixin<FastRandomContext>.bitbuf;
    *(undefined8 *)((this->m_most_recent_block_hash).super_base_blob<256U>.m_data._M_elems + 8) =
         local_c0.super_RandomMixin<FastRandomContext>._8_8_;
    (this->m_most_recent_block).super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_most_recent_block).
                super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    (this->m_most_recent_compact_block).
    super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_100;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_most_recent_compact_block).
                super___shared_ptr<const_CBlockHeaderAndShortTxIDs,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_f8);
    __p = local_120._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_120._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::
    __uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
    ::reset((__uniq_ptr_impl<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<const_std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
             *)&this->m_most_recent_block_txs,(pointer)__p);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_f0);
    std::
    unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>,_std::default_delete<std::map<uint256,_std::shared_ptr<const_CTransaction>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::shared_ptr<const_CTransaction>_>_>_>_>_>
                   *)&local_120);
    this_00 = this->m_connman;
    local_f0._8_8_ = 0;
    local_f0._M_unused._M_object = operator_new(0x20);
    *(PeerManagerImpl **)local_f0._M_unused._0_8_ = this;
    *(CBlockIndex **)((long)local_f0._M_unused._0_8_ + 8) = pindex;
    *(element_type ***)((long)local_f0._M_unused._0_8_ + 0x10) = &local_110;
    *(FastRandomContext **)((long)local_f0._M_unused._0_8_ + 0x18) = &local_c0;
    local_d8 = std::
               _Function_handler<void_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:2216:27)>
               ::_M_invoke;
    local_e0 = std::
               _Function_handler<void_(CNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp:2216:27)>
               ::_M_manager;
    CConnman::ForEachNode(this_00,(NodeFn *)&local_f0);
    if (local_e0 != (code *)0x0) {
      (*local_e0)(&local_f0,&local_f0,__destroy_functor);
    }
    if (local_108 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_d0);
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::NewPoWValidBlock(const CBlockIndex *pindex, const std::shared_ptr<const CBlock>& pblock)
{
    auto pcmpctblock = std::make_shared<const CBlockHeaderAndShortTxIDs>(*pblock, FastRandomContext().rand64());

    LOCK(cs_main);

    if (pindex->nHeight <= m_highest_fast_announce)
        return;
    m_highest_fast_announce = pindex->nHeight;

    if (!DeploymentActiveAt(*pindex, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) return;

    uint256 hashBlock(pblock->GetHash());
    const std::shared_future<CSerializedNetMsg> lazy_ser{
        std::async(std::launch::deferred, [&] { return NetMsg::Make(NetMsgType::CMPCTBLOCK, *pcmpctblock); })};

    {
        auto most_recent_block_txs = std::make_unique<std::map<uint256, CTransactionRef>>();
        for (const auto& tx : pblock->vtx) {
            most_recent_block_txs->emplace(tx->GetHash(), tx);
            most_recent_block_txs->emplace(tx->GetWitnessHash(), tx);
        }

        LOCK(m_most_recent_block_mutex);
        m_most_recent_block_hash = hashBlock;
        m_most_recent_block = pblock;
        m_most_recent_compact_block = pcmpctblock;
        m_most_recent_block_txs = std::move(most_recent_block_txs);
    }

    m_connman.ForEachNode([this, pindex, &lazy_ser, &hashBlock](CNode* pnode) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        AssertLockHeld(::cs_main);

        if (pnode->GetCommonVersion() < INVALID_CB_NO_BAN_VERSION || pnode->fDisconnect)
            return;
        ProcessBlockAvailability(pnode->GetId());
        CNodeState &state = *State(pnode->GetId());
        // If the peer has, or we announced to them the previous block already,
        // but we don't think they have this one, go ahead and announce it
        if (state.m_requested_hb_cmpctblocks && !PeerHasHeader(&state, pindex) && PeerHasHeader(&state, pindex->pprev)) {

            LogDebug(BCLog::NET, "%s sending header-and-ids %s to peer=%d\n", "PeerManager::NewPoWValidBlock",
                    hashBlock.ToString(), pnode->GetId());

            const CSerializedNetMsg& ser_cmpctblock{lazy_ser.get()};
            PushMessage(*pnode, ser_cmpctblock.Copy());
            state.pindexBestHeaderSent = pindex;
        }
    });
}